

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coincontrol.cpp
# Opt level: O0

pair<std::optional<CScript>,_std::optional<CScriptWitness>_> * __thiscall
wallet::CCoinControl::GetScripts(CCoinControl *this,COutPoint *outpoint)

{
  long lVar1;
  bool bVar2;
  key_type *in_RDX;
  map<COutPoint,_wallet::PreselectedInput,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
  *in_RSI;
  PreselectedInput *in_RDI;
  long in_FS_OFFSET;
  const_iterator it;
  key_type *in_stack_ffffffffffffffa8;
  PreselectedInput *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  std::
  map<COutPoint,_wallet::PreselectedInput,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
  ::find((map<COutPoint,_wallet::PreselectedInput,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
          *)in_RDI,in_stack_ffffffffffffffa8);
  std::
  map<COutPoint,_wallet::PreselectedInput,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
  ::end((map<COutPoint,_wallet::PreselectedInput,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
         *)in_RDI);
  bVar2 = std::operator==((_Self *)this_00,(_Self *)in_RDI);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    std::make_pair<std::nullopt_t_const&,std::nullopt_t_const&>
              ((nullopt_t *)in_RDI,(nullopt_t *)in_stack_ffffffffffffffa8);
    std::pair<std::optional<CScript>,_std::optional<CScriptWitness>_>::
    pair<std::nullopt_t,_std::nullopt_t,_true>
              ((pair<std::optional<CScript>,_std::optional<CScriptWitness>_> *)this_00,
               (pair<std::nullopt_t,_std::nullopt_t> *)in_RDI);
  }
  else {
    std::
    map<COutPoint,_wallet::PreselectedInput,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
    ::at(in_RSI,in_RDX);
    PreselectedInput::GetScripts(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (pair<std::optional<CScript>,_std::optional<CScriptWitness>_> *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

std::pair<std::optional<CScript>, std::optional<CScriptWitness>> CCoinControl::GetScripts(const COutPoint& outpoint) const
{
    const auto it = m_selected.find(outpoint);
    return it != m_selected.end() ? m_selected.at(outpoint).GetScripts() : std::make_pair(std::nullopt, std::nullopt);
}